

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cpp
# Opt level: O1

idx_t __thiscall
duckdb::roaring::ContainerMetadataCollection::Serialize
          (ContainerMetadataCollection *this,data_ptr_t dest)

{
  idx_t iVar1;
  unsigned_long uVar2;
  ulong uVar3;
  pointer puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  uint8_t *puVar12;
  long lVar13;
  data_ptr_t __dest;
  pointer in;
  ulong uVar14;
  pointer puVar15;
  uint8_t local_58 [40];
  
  uVar5 = this->count_in_segment;
  if ((uVar5 & 0x1f) != 0) {
    uVar2 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar5 & 0x1f);
    uVar5 = (uVar5 - uVar2) + 0x20;
  }
  uVar10 = this->runs_in_segment;
  if ((uVar10 & 0x1f) != 0) {
    uVar2 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar10 & 0x1f);
    uVar10 = (uVar10 - uVar2) + 0x20;
  }
  iVar1 = this->arrays_in_segment;
  uVar7 = this->count_in_segment;
  puVar4 = (this->container_type).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + -uVar7;
  uVar14 = (ulong)((uint)uVar7 & 0x1f);
  uVar3 = uVar7 & 0xffffffffffffffe0;
  if (uVar3 != 0) {
    uVar8 = 0;
    uVar6 = 0;
    puVar15 = puVar4;
    do {
      lVar11 = 0;
      in = puVar15;
      do {
        duckdb_fastpforlib::internal::__fastpack2
                  (in,dest + lVar11 + (uVar8 & 0x3ffffffffffffff) * 8);
        lVar11 = lVar11 + 2;
        in = in + 8;
      } while (lVar11 != 8);
      uVar6 = uVar6 + 0x20;
      uVar8 = uVar8 + 1;
      puVar15 = puVar15 + 0x20;
    } while (uVar6 < uVar3);
  }
  uVar5 = uVar5 >> 2 & 0x1fffffffffffffff;
  if (uVar14 != 0) {
    lVar11 = 0;
    switchD_0105b559::default(local_58 + uVar14,0,0x20 - uVar14);
    switchD_015ff80e::default(local_58,puVar4 + uVar3,uVar14);
    puVar12 = dest + (uVar7 >> 2 & 0x1ffffffffffffff8);
    do {
      duckdb_fastpforlib::internal::__fastpack2(local_58 + lVar11,puVar12);
      puVar12 = puVar12 + 2;
      lVar11 = lVar11 + 8;
    } while (lVar11 != 0x20);
  }
  uVar10 = uVar10 * 7 >> 3;
  __dest = dest + uVar5;
  puVar4 = (this->number_of_runs).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->number_of_runs).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != puVar4) {
    uVar7 = this->runs_in_segment;
    lVar11 = (long)puVar4 - uVar7;
    uVar3 = (ulong)((uint)uVar7 & 0x1f);
    uVar7 = uVar7 & 0xffffffffffffffe0;
    if (uVar7 != 0) {
      uVar14 = 0;
      uVar6 = 0;
      lVar13 = lVar11;
      do {
        puVar12 = dest + (uVar14 >> 3) + uVar5;
        lVar9 = 0;
        do {
          duckdb_fastpforlib::internal::__fastpack7((uint8_t *)(lVar13 + lVar9),puVar12);
          puVar12 = puVar12 + 7;
          lVar9 = lVar9 + 8;
        } while (lVar9 != 0x20);
        uVar6 = uVar6 + 0x20;
        uVar14 = uVar14 + 0xe0;
        lVar13 = lVar13 + 0x20;
      } while (uVar6 < uVar7);
    }
    if (uVar3 != 0) {
      lVar13 = 0;
      switchD_0105b559::default(local_58 + uVar3,0,0x20 - uVar3);
      switchD_015ff80e::default(local_58,(void *)(lVar11 + uVar7),uVar3);
      puVar12 = __dest + (uVar7 * 7 >> 3);
      do {
        duckdb_fastpforlib::internal::__fastpack7(local_58 + lVar13,puVar12);
        puVar12 = puVar12 + 7;
        lVar13 = lVar13 + 8;
      } while (lVar13 != 0x20);
    }
    __dest = __dest + uVar10;
  }
  puVar4 = (this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != puVar4) {
    switchD_015ff80e::default(__dest,puVar4 + -this->arrays_in_segment,this->arrays_in_segment);
  }
  return iVar1 + uVar5 + uVar10;
}

Assistant:

idx_t ContainerMetadataCollection::Serialize(data_ptr_t dest) const {
	// Element sizes (in bits) for written metadata
	// +======================================+
	// |mmmmmm|rrrrrr|aaaaaaa|                |
	// +======================================+
	//
	// m: 2: (1: is_run, 1: is_inverted)
	// r: 7: number_of_runs
	// a: 8: cardinality

	idx_t types_size = BitpackingPrimitives::GetRequiredSize(count_in_segment, CONTAINER_TYPE_BITWIDTH);
	idx_t runs_size = BitpackingPrimitives::GetRequiredSize(runs_in_segment, RUN_CONTAINER_SIZE_BITWIDTH);
	idx_t arrays_size = sizeof(uint8_t) * arrays_in_segment;

	idx_t types_offset = container_type.size() - count_in_segment;
	data_ptr_t types_data = (data_ptr_t)(container_type.data()); // NOLINT: c-style cast (for const)
	BitpackingPrimitives::PackBuffer<uint8_t>(dest, types_data + types_offset, count_in_segment,
	                                          CONTAINER_TYPE_BITWIDTH);
	dest += types_size;

	if (!number_of_runs.empty()) {
		idx_t runs_offset = number_of_runs.size() - runs_in_segment;
		data_ptr_t run_data = (data_ptr_t)(number_of_runs.data()); // NOLINT: c-style cast (for const)
		BitpackingPrimitives::PackBuffer<uint8_t>(dest, run_data + runs_offset, runs_in_segment,
		                                          RUN_CONTAINER_SIZE_BITWIDTH);
		dest += runs_size;
	}

	if (!cardinality.empty()) {
		idx_t arrays_offset = cardinality.size() - arrays_in_segment;
		data_ptr_t arrays_data = (data_ptr_t)(cardinality.data()); // NOLINT: c-style cast (for const)
		memcpy(dest, arrays_data + arrays_offset, sizeof(uint8_t) * arrays_in_segment);
	}
	return types_size + runs_size + arrays_size;
}